

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrepEdgeIntegrationPoints.h
# Opt level: O3

pair<std::vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>,_std::vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>_>
* anurbs::BrepEdgeIntegrationPoints::get
            (pair<std::vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>,_std::vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>_>
             *__return_storage_ptr__,BrepEdge *edge,double tolerance,double tessellation_tolerance)

{
  double *__args_1;
  element_type *peVar1;
  pointer pRVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  long *plVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  long *plVar8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  double dVar10;
  double dVar11;
  pointer pdVar12;
  pointer pdVar13;
  BrepTrim *pBVar14;
  ulong uVar15;
  pointer ptVar16;
  long lVar17;
  double *pdVar18;
  IntegrationPointList<1> *pIVar19;
  double *pdVar20;
  pointer ptVar21;
  size_type __n;
  _Head_base<0UL,_double,_false> *__args;
  IntegrationPointList<1> *pIVar22;
  pointer ptVar23;
  BrepTrim *pBVar24;
  vector<double,_std::allocator<double>_> spans_on_curve_b;
  IntegrationPointList<1> points;
  Pointer<CurveOnSurface<3>_> curve_3d_b;
  Pointer<CurveOnSurface<3>_> curve_3d_a;
  Vector point;
  IntegrationPointList<1> integration_points_b;
  IntegrationPointList<1> integration_points_a;
  double t_b;
  double t_a;
  double weight;
  PointOnCurveProjection<3L> projection_a;
  PointOnCurveProjection<3L> projection_b;
  vector<double,_std::allocator<double>_> local_248;
  BrepTrim *local_230;
  IntegrationPointList<1> local_228;
  undefined8 local_210;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_208;
  undefined1 local_200 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1e8;
  Vector local_1e0;
  vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_> local_1c8;
  vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_> local_1a8;
  pair<std::vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>,_std::vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>_>
  *local_188;
  BrepTrim local_180;
  undefined1 local_140 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_128;
  element_type *local_120;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_118;
  double local_108;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_f8;
  double local_e0;
  PolylineMapper<3L> *local_c0;
  Interval local_b8;
  undefined1 local_a8 [112];
  _Head_base<0UL,_anurbs::PolylineMapper<3L>_*,_false> local_38;
  
  local_1a8.
  super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1a8.
  super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8.
  super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.
  super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c8.
  super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.
  super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pRVar2 = (edge->m_trims).
           super__Vector_base<anurbs::Ref<anurbs::BrepTrim>,_std::allocator<anurbs::Ref<anurbs::BrepTrim>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_140._16_8_ =
       (pRVar2->m_entry).
       super___shared_ptr<anurbs::Entry<anurbs::BrepTrim>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_128._M_pi =
       (pRVar2->m_entry).
       super___shared_ptr<anurbs::Entry<anurbs::BrepTrim>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (local_128._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_128._M_pi)->_M_use_count = (local_128._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_128._M_pi)->_M_use_count = (local_128._M_pi)->_M_use_count + 1;
    }
  }
  local_230 = (BrepTrim *)tessellation_tolerance;
  local_188 = __return_storage_ptr__;
  pBVar14 = Ref<anurbs::BrepTrim>::operator*((Ref<anurbs::BrepTrim> *)(local_140 + 0x10));
  if (local_128._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_128._M_pi);
  }
  pRVar2 = (edge->m_trims).
           super__Vector_base<anurbs::Ref<anurbs::BrepTrim>,_std::allocator<anurbs::Ref<anurbs::BrepTrim>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_140._16_8_ =
       pRVar2[1].m_entry.
       super___shared_ptr<anurbs::Entry<anurbs::BrepTrim>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_128._M_pi =
       pRVar2[1].m_entry.
       super___shared_ptr<anurbs::Entry<anurbs::BrepTrim>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (local_128._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_128._M_pi)->_M_use_count = (local_128._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_128._M_pi)->_M_use_count = (local_128._M_pi)->_M_use_count + 1;
    }
  }
  Ref<anurbs::BrepTrim>::operator*((Ref<anurbs::BrepTrim> *)(local_140 + 0x10));
  if (local_128._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_128._M_pi);
  }
  BrepTrim::curve_3d((BrepTrim *)(local_200 + 0x10));
  BrepTrim::curve_3d((BrepTrim *)local_200);
  local_180.m_curve_geometry.m_entry.
  super___shared_ptr<anurbs::Entry<anurbs::NurbsCurveGeometry<2L>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)local_200._16_8_;
  local_180.m_curve_geometry.m_entry.
  super___shared_ptr<anurbs::Entry<anurbs::NurbsCurveGeometry<2L>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_1e8._M_pi;
  if (local_1e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_1e8._M_pi)->_M_use_count = (local_1e8._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_1e8._M_pi)->_M_use_count = (local_1e8._M_pi)->_M_use_count + 1;
    }
  }
  PointOnCurveProjection<3L>::PointOnCurveProjection
            ((PointOnCurveProjection<3L> *)(local_140 + 0x10),
             (Pointer<CurveBaseD>_conflict *)&local_180.m_curve_geometry,tolerance,(double)local_230
            );
  if (local_180.m_curve_geometry.m_entry.
      super___shared_ptr<anurbs::Entry<anurbs::NurbsCurveGeometry<2L>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_180.m_curve_geometry.m_entry.
               super___shared_ptr<anurbs::Entry<anurbs::NurbsCurveGeometry<2L>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_180.m_edge.m_entry.
  super___shared_ptr<anurbs::Entry<anurbs::BrepEdge>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_200._0_8_;
  local_180.m_edge.m_entry.
  super___shared_ptr<anurbs::Entry<anurbs::BrepEdge>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_200._8_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_200._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_200._8_8_ + 8) = *(_Atomic_word *)(local_200._8_8_ + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_200._8_8_ + 8) = *(_Atomic_word *)(local_200._8_8_ + 8) + 1;
    }
  }
  pBVar24 = local_230;
  PointOnCurveProjection<3L>::PointOnCurveProjection
            ((PointOnCurveProjection<3L> *)local_a8,
             (Pointer<CurveBaseD>_conflict *)&local_180.m_edge,tolerance,(double)local_230);
  if (local_180.m_edge.m_entry.
      super___shared_ptr<anurbs::Entry<anurbs::BrepEdge>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_180.m_edge.m_entry.
               super___shared_ptr<anurbs::Entry<anurbs::BrepEdge>,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (double *)0x0;
  local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  (*((EntryBase *)local_200._0_8_)->_vptr_EntryBase[4])(&local_228);
  ptVar16 = local_228.
            super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (local_228.
      super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_228.
      super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    ptVar21 = local_228.
              super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_1e0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
      [0] = (ptVar21->super__Tuple_impl<0UL,_double,_double>).super__Tuple_impl<1UL,_double>.
            super__Head_base<1UL,_double,_false>._M_head_impl;
      if (local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&local_248,
                   (iterator)
                   local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,(double *)&local_1e0);
      }
      else {
        *local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish =
             local_1e0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data
             .array[0];
        local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      ptVar21 = ptVar21 + 1;
    } while (ptVar21 != ptVar16);
  }
  if (local_228.
      super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_228.
                    super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_228.
                          super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_228.
                          super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pIVar22 = &local_228;
  (*((EntryBase *)local_200._16_8_)->_vptr_EntryBase[4])(pIVar22);
  if (local_228.
      super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_228.
      super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    ptVar16 = local_228.
              super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_230 = pBVar14;
    do {
      (*((EntryBase *)local_200._16_8_)->_vptr_EntryBase[5])
                (SUB84((ptVar16->super__Tuple_impl<0UL,_double,_double>).
                       super__Tuple_impl<1UL,_double>.super__Head_base<1UL,_double,_false>.
                       _M_head_impl,0),&local_1e0);
      PointOnCurveProjection<3L>::compute((PointOnCurveProjection<3L> *)local_a8,&local_1e0,0.0);
      local_180.m_loop.m_entry.
      super___shared_ptr<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_a8._80_8_;
      if (local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)&local_248,
                   (iterator)
                   local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,(double *)&local_180);
      }
      else {
        *local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish = (double)local_a8._80_8_;
        local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      ptVar16 = ptVar16 + 1;
    } while (ptVar16 !=
             local_228.
             super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_228.
      super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_228.
                    super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_228.
                          super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_228.
                          super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  (*((EntryBase *)local_200._0_8_)->_vptr_EntryBase[3])();
  local_228.
  super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)pBVar24;
  if (local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (&local_248,
               (iterator)
               local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish,(double *)&local_228);
  }
  else {
    *local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
     _M_finish = (double)pBVar24;
    local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  pdVar13 = local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pdVar12 = local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    uVar15 = (long)local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
    lVar17 = 0x3f;
    if (uVar15 != 0) {
      for (; uVar15 >> lVar17 == 0; lVar17 = lVar17 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar17 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pdVar12,pdVar13);
  }
  BrepTrim::face(&local_180);
  BrepTrim::face((BrepTrim *)local_140);
  peVar3 = ((local_180.m_loop.m_entry.
             super___shared_ptr<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
           ->m_data).super___shared_ptr<anurbs::BrepLoop,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var4 = ((local_180.m_loop.m_entry.
             super___shared_ptr<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
           ->m_data).super___shared_ptr<anurbs::BrepLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  peVar5 = peVar3[1].m_face.m_entry.
           super___shared_ptr<anurbs::Entry<anurbs::BrepFace>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var6 = peVar3[1].m_face.m_entry.
           super___shared_ptr<anurbs::Entry<anurbs::BrepFace>,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
    }
  }
  plVar7 = *(long **)&(peVar5->m_data).
                      super___shared_ptr<anurbs::BrepFace,_(__gnu_cxx::_Lock_policy)2>;
  this._M_pi = (peVar5->m_data).super___shared_ptr<anurbs::BrepFace,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
  if (this._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (this._M_pi)->_M_use_count = (this._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (this._M_pi)->_M_use_count = (this._M_pi)->_M_use_count + 1;
    }
  }
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
  }
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  peVar3 = (((shared_ptr<anurbs::BrepLoop> *)(local_140._0_8_ + 0x28))->
           super___shared_ptr<anurbs::BrepLoop,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var4 = (((shared_ptr<anurbs::BrepLoop> *)(local_140._0_8_ + 0x28))->
           super___shared_ptr<anurbs::BrepLoop,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  peVar5 = peVar3[1].m_face.m_entry.
           super___shared_ptr<anurbs::Entry<anurbs::BrepFace>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var6 = peVar3[1].m_face.m_entry.
           super___shared_ptr<anurbs::Entry<anurbs::BrepFace>,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
    }
  }
  plVar8 = *(long **)&(peVar5->m_data).
                      super___shared_ptr<anurbs::BrepFace,_(__gnu_cxx::_Lock_policy)2>;
  _Var9._M_pi = (peVar5->m_data).super___shared_ptr<anurbs::BrepFace,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  if (_Var9._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Var9._M_pi)->_M_use_count = (_Var9._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Var9._M_pi)->_M_use_count = (_Var9._M_pi)->_M_use_count + 1;
    }
  }
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
  }
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  ptVar16 = (pointer)(**(code **)(*plVar7 + 0x10))(plVar7);
  local_228.
  super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = ptVar16;
  local_228.
  super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)(**(code **)(*plVar7 + 0x18))(plVar7);
  local_228.
  super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(**(code **)(*plVar8 + 0x10))(plVar8)
  ;
  local_210 = (**(code **)(*plVar8 + 0x18))(plVar8);
  lVar17 = 8;
  do {
    pIVar19 = (IntegrationPointList<1> *)
              ((long)&local_228.
                      super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar17);
    ptVar21 = (pIVar19->
              super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    ptVar23 = ptVar16;
    if ((long)ptVar16 <= (long)ptVar21) {
      ptVar23 = ptVar21;
    }
    if ((long)ptVar16 < (long)ptVar21) {
      pIVar22 = pIVar19;
    }
    lVar17 = lVar17 + 8;
    ptVar16 = ptVar23;
  } while (lVar17 != 0x20);
  local_230 = (BrepTrim *)
              (pIVar22->
              super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
  __n = (long)((long)&(((pointer)local_230)->super__Tuple_impl<0UL,_double,_double>).
                      super__Tuple_impl<1UL,_double>.super__Head_base<1UL,_double,_false>.
                      _M_head_impl + 2) *
        (((long)local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start >> 3) + -1);
  local_208 = _Var9._M_pi;
  std::vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>::reserve
            (&local_1a8,__n);
  std::vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>::reserve
            (&local_1c8,__n);
  if (8 < (long)local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start) {
    local_230 = (BrepTrim *)
                ((long)&(((_Tuple_impl<0UL,_double,_double> *)&local_230->m_loop)->
                        super__Tuple_impl<1UL,_double>).super__Head_base<1UL,_double,_false>.
                        _M_head_impl + 1);
    lVar17 = 1;
    __args_1 = &local_180.m_domain.m_t1;
    pdVar18 = local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar20 = local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
    do {
      local_b8.m_t0 = pdVar18[lVar17 + -1];
      local_b8.m_t1 = (pdVar18 + lVar17 + -1)[1];
      if (1e-07 <= ABS(local_b8.m_t1 - local_b8.m_t0)) {
        IntegrationPoints::get(&local_228,(size_t)local_230,&local_b8);
        ptVar16 = local_228.
                  super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (local_228.
            super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_228.
            super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          __args = &((local_228.
                      super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super__Tuple_impl<0UL,_double,_double>).super__Head_base<0UL,_double,_false>;
          do {
            (*((EntryBase *)local_200._0_8_)->_vptr_EntryBase[6])
                      (SUB84(__args->_M_head_impl,0),&local_1e0,local_200._0_8_,1);
            dVar10 = *(double *)
                      &((string *)
                       ((long)local_1e0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>
                              .m_storage.m_data.array[0] + 8))->field_2;
            dVar11 = *(double *)
                      ((long)&((string *)
                              ((long)local_1e0.
                                     super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                                     m_storage.m_data.array[0] + 8))->field_2 + 8);
            peVar1 = (((shared_ptr<anurbs::NurbsCurveGeometry<2L>_> *)
                      ((long)local_1e0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                             m_storage.m_data.array[0] + 0x28))->
                     super___shared_ptr<anurbs::NurbsCurveGeometry<2L>,_(__gnu_cxx::_Lock_policy)2>)
                     ._M_ptr;
            local_180.m_domain.m_t1 =
                 SQRT((double)peVar1 * (double)peVar1 + dVar11 * dVar11 + dVar10 * dVar10) *
                 (((_Tuple_impl<0UL,_double,_double> *)(__args + -1))->
                 super__Tuple_impl<1UL,_double>).super__Head_base<1UL,_double,_false>._M_head_impl;
            std::vector<std::tuple<double,double>,std::allocator<std::tuple<double,double>>>::
            emplace_back<double_const&,double_const&>
                      ((vector<std::tuple<double,double>,std::allocator<std::tuple<double,double>>>
                        *)&local_1c8,&__args->_M_head_impl,__args_1);
            PointOnCurveProjection<3L>::compute
                      ((PointOnCurveProjection<3L> *)(local_140 + 0x10),
                       (Vector *)
                       local_1e0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                       m_storage.m_data.array[0],0.0);
            local_180.m_domain.m_t0 = local_e0;
            std::vector<std::tuple<double,double>,std::allocator<std::tuple<double,double>>>::
            emplace_back<double_const&,double_const&>
                      ((vector<std::tuple<double,double>,std::allocator<std::tuple<double,double>>>
                        *)&local_1a8,&local_180.m_domain.m_t0,__args_1);
            if ((element_type *)
                local_1e0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                m_data.array[0] != (element_type *)0x0) {
              operator_delete((void *)local_1e0.
                                      super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                                      m_storage.m_data.array[0],
                              (long)local_1e0.
                                    super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                                    m_storage.m_data.array[2] -
                              (long)local_1e0.
                                    super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                                    m_storage.m_data.array[0]);
            }
            ptVar21 = (pointer)(__args + 1);
            __args = __args + 2;
          } while (ptVar21 != ptVar16);
        }
        pdVar18 = local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar20 = local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        if (local_228.
            super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_228.
                          super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_228.
                                super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_228.
                                super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
          pdVar18 = local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pdVar20 = local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        }
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 < (long)pdVar20 - (long)pdVar18 >> 3);
  }
  std::
  pair<std::vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>,_std::vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>_>
  ::
  pair<std::vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>_&,_std::vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>_&,_true>
            (local_188,&local_1a8,&local_1c8);
  if (local_208 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_208);
  }
  if (this._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_140._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_140._8_8_);
  }
  if (local_180.m_loop.m_entry.
      super___shared_ptr<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_180.m_loop.m_entry.
               super___shared_ptr<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((_Head_base<0UL,_anurbs::PolylineMapper<3L>_*,_false>)local_38._M_head_impl !=
      (_Head_base<0UL,_anurbs::PolylineMapper<3L>_*,_false>)0x0) {
    std::default_delete<anurbs::PolylineMapper<3L>_>::operator()
              ((default_delete<anurbs::PolylineMapper<3L>_> *)&local_38,local_38._M_head_impl);
  }
  local_38._M_head_impl = (PolylineMapper<3L> *)0x0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._56_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._56_8_);
  }
  if ((pointer)local_a8._24_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._24_8_,local_a8._40_8_ - local_a8._24_8_);
  }
  if ((pointer)local_a8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._0_8_,local_a8._16_8_ - local_a8._0_8_);
  }
  if (local_c0 != (PolylineMapper<3L> *)0x0) {
    std::default_delete<anurbs::PolylineMapper<3L>_>::operator()
              ((default_delete<anurbs::PolylineMapper<3L>_> *)&local_c0,local_c0);
  }
  local_c0 = (PolylineMapper<3L> *)0x0;
  if (local_f8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f8);
  }
  if (local_118._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    operator_delete(local_118._M_pi,(long)local_108 - (long)local_118._M_pi);
  }
  if ((element_type *)local_140._16_8_ != (element_type *)0x0) {
    operator_delete((void *)local_140._16_8_,(long)local_120 - local_140._16_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_200._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_200._8_8_);
  }
  if (local_1e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1e8._M_pi);
  }
  if (local_1c8.
      super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1c8.
                    super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1c8.
                          super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c8.
                          super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1a8.
      super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a8.
                    super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1a8.
                          super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1a8.
                          super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return local_188;
}

Assistant:

static std::pair<IntegrationPointList<1>, IntegrationPointList<1>> get(const BrepEdge& edge, const double tolerance, const double tessellation_tolerance)
    {
        IntegrationPointList<1> integration_points_a;
        IntegrationPointList<1> integration_points_b;

        // FIXME: check nb_trims == 2

        const auto& trim_a = *edge.trim(0);
        const auto& trim_b = *edge.trim(1);

        const auto curve_3d_a = trim_a.curve_3d();
        const auto curve_3d_b = trim_b.curve_3d();

        PointOnCurveProjection<3> projection_a(curve_3d_a, tolerance, tessellation_tolerance);
        PointOnCurveProjection<3> projection_b(curve_3d_b, tolerance, tessellation_tolerance);

        std::vector<double> spans_on_curve_b;

        for (const auto span_b : curve_3d_b->spans()) {
            spans_on_curve_b.emplace_back(span_b.t0());
        }

        for (const auto span_a : curve_3d_a->spans()) {
            const double t_a = span_a.t0();

            const Vector point = curve_3d_a->point_at(t_a);

            projection_b.compute(point);

            const double t_b = projection_b.parameter();

            spans_on_curve_b.emplace_back(t_b);
        }

        spans_on_curve_b.emplace_back(curve_3d_b->domain().t1());

        std::sort(spans_on_curve_b.begin(), spans_on_curve_b.end());

        const auto& face_a = trim_a.face();
        const auto& face_b = trim_b.face();

        const auto& surface_3d_a = face_a->surface_geometry().data();
        const auto& surface_3d_b = face_b->surface_geometry().data();

        const auto degree = std::max({surface_3d_a->degree_u(),
                                surface_3d_a->degree_v(), surface_3d_b->degree_u(),
                                surface_3d_b->degree_v()})
            + 1;

        const auto nb_integration_points = (length(spans_on_curve_b) - 1) * (degree + 1);

        integration_points_a.reserve(nb_integration_points);
        integration_points_b.reserve(nb_integration_points);

        for (Index i = 1; i < length(spans_on_curve_b); i++) {
            const auto t0_b = spans_on_curve_b[i - 1];
            const auto t1_b = spans_on_curve_b[i];

            const Interval span_b(t0_b, t1_b);

            if (span_b.length() < 1e-7) {
                continue;
            }

            const auto points = IntegrationPoints::get(degree, span_b);

            for (const auto& [t_b, weight_b] : points) {
                const auto ders = curve_3d_b->derivatives_at(t_b, 1);

                const auto tangent = ders[1];
                const auto weight = weight_b * norm(tangent);

                integration_points_b.emplace_back(t_b, weight);

                projection_a.compute(ders[0]);

                const auto t_a = projection_a.parameter();

                integration_points_a.emplace_back(t_a, weight);
            }
        }

        return {integration_points_a, integration_points_b};
    }